

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_default_voice_dir_path(OpenJTalk *oj)

{
  _Bool _Var1;
  size_t sVar2;
  long in_RDI;
  char **d;
  char temp [260];
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char **path;
  char local_118 [264];
  long local_10;
  
  if (in_RDI != 0) {
    local_10 = in_RDI;
    clear_path_string(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    sVar2 = strlen(g_data_install_path);
    if (sVar2 != 0) {
      for (path = G_DEFAULT_VOICE_DIR_NAMES; *path != (char *)0x0; path = path + 1) {
        _Var1 = search_directory((char *)path,in_stack_fffffffffffffed8,(char *)0x193498);
        if (_Var1) {
          strcpy((char *)(local_10 + 0x10c),local_118);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool set_default_voice_dir_path(OpenJTalk *oj)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 標準のインストールフォルダから可能性のある名前を探す
	if (g_data_install_path != NULL && strlen(g_data_install_path) != 0)
	{
		for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(g_data_install_path, *d, temp))
			{
				goto return_true;
			}
		}
	}
	return false;

return_true:
	strcpy(oj->dn_voice_dir_path, temp);
	return true;
}